

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::clara::detail::BasicResult<void>::BasicResult
          (BasicResult<void> *this,Type type,string *message)

{
  pointer pcVar1;
  
  (this->super_ResultValueBase<void>).super_ResultBase.m_type = type;
  (this->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001984f0;
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_errorMessage,pcVar1,pcVar1 + message->_M_string_length);
  if ((this->super_ResultValueBase<void>).super_ResultBase.m_type != Ok) {
    return;
  }
  __assert_fail("m_type != ResultBase::Ok",
                "/workspace/llm4binary/github/license_all_cmakelists_25/discretedynamics[P]cyclone/build_O3/_deps/catch2-src/single_include/catch2/catch.hpp"
                ,0x2349,
                "Catch::clara::detail::BasicResult<>::BasicResult(ResultBase::Type, const std::string &) [T = void]"
               );
}

Assistant:

BasicResult( ResultBase::Type type, std::string const &message )
        :   ResultValueBase<T>(type),
            m_errorMessage(message)
        {
            assert( m_type != ResultBase::Ok );
        }